

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O0

void __thiscall perfetto::Category::Category(Category *this,char *name_)

{
  NameSizes NVar1;
  char *pcVar2;
  char *name__local;
  Category *this_local;
  
  pcVar2 = CheckIsValidCategory(name_);
  this->name = pcVar2;
  this->description = (char *)0x0;
  memset(&this->tags,0,0x20);
  NVar1 = ComputeNameSizes(name_);
  *&(this->name_sizes_)._M_elems = NVar1._M_elems;
  return;
}

Assistant:

constexpr explicit Category(const char* name_)
      : name(CheckIsValidCategory(name_)),
        name_sizes_(ComputeNameSizes(name_)) {}